

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanTarget.cpp
# Opt level: O0

void __thiscall
Outputs::Display::OpenGL::ScanTarget::update(ScanTarget *this,int param_1,int output_height)

{
  size_t sVar1;
  int iVar2;
  anon_class_16_2_dd42aa12 local_68;
  function<void_()> local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  rep local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  rep local_20;
  int local_18;
  int local_14;
  int output_height_local;
  int param_2_local;
  ScanTarget *this_local;
  
  local_18 = output_height;
  local_14 = param_1;
  _output_height_local = this;
  if (this->fence_ != (GLsync)0x0) {
    iVar2 = glClientWaitSync(this->fence_,1,0);
    if (iVar2 == 0x911b) {
      sVar1 = this->lines_submitted_;
      local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_20 = (rep)std::chrono::operator-(&local_28,&this->line_submission_begin_time_);
      Metrics::announce_draw_status
                (&(this->super_BufferingScanTarget).display_metrics_,sVar1,(duration)local_20,false)
      ;
      return;
    }
    this->fence_ = (GLsync)0x0;
  }
  sVar1 = this->lines_submitted_;
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(&local_38,&this->line_submission_begin_time_);
  Metrics::announce_draw_status
            (&(this->super_BufferingScanTarget).display_metrics_,sVar1,(duration)local_30,true);
  local_68.output_height = local_18;
  local_68.this = this;
  std::function<void()>::function<Outputs::Display::OpenGL::ScanTarget::update(int,int)::__0,void>
            ((function<void()> *)&local_58,&local_68);
  BufferingScanTarget::perform(&this->super_BufferingScanTarget,&local_58);
  std::function<void_()>::~function(&local_58);
  return;
}

Assistant:

void ScanTarget::update(int, int output_height) {
	// If the GPU is still busy, don't wait; we'll catch it next time.
	if(fence_ != nullptr) {
		if(glClientWaitSync(fence_, GL_SYNC_FLUSH_COMMANDS_BIT, 0) == GL_TIMEOUT_EXPIRED) {
			display_metrics_.announce_draw_status(
				lines_submitted_,
				std::chrono::high_resolution_clock::now() - line_submission_begin_time_,
				false);
			return;
		}
		fence_ = nullptr;
	}

	// Update the display metrics.
	display_metrics_.announce_draw_status(
		lines_submitted_,
		std::chrono::high_resolution_clock::now() - line_submission_begin_time_,
		true);

	// Grab the new output list.
	perform([=] {
		OutputArea area = get_output_area();

		// Establish the pipeline if necessary.
		const auto new_modals = BufferingScanTarget::new_modals();
		const bool did_setup_pipeline = bool(new_modals);
		if(did_setup_pipeline) {
			setup_pipeline();
		}

		// Determine the start time of this submission group and the number of lines it will contain.
		line_submission_begin_time_ = std::chrono::high_resolution_clock::now();
		lines_submitted_ = (area.end.line - area.start.line + line_buffer_.size()) % line_buffer_.size();

		// Submit scans; only the new ones need to be communicated.
		size_t new_scans = (area.end.scan - area.start.scan + scan_buffer_.size()) % scan_buffer_.size();
		if(new_scans) {
			test_gl(glBindBuffer, GL_ARRAY_BUFFER, scan_buffer_name_);

			// Map only the required portion of the buffer.
			const size_t new_scans_size = new_scans * sizeof(Scan);
			uint8_t *const destination = static_cast<uint8_t *>(
				glMapBufferRange(GL_ARRAY_BUFFER, 0, GLsizeiptr(new_scans_size), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT)
			);
			test_gl_error();

			// Copy as a single chunk if possible; otherwise copy in two parts.
			if(area.start.scan < area.end.scan) {
				memcpy(destination, &scan_buffer_[size_t(area.start.scan)], new_scans_size);
			} else {
				const size_t first_portion_length = (scan_buffer_.size() - area.start.scan) * sizeof(Scan);
				memcpy(destination, &scan_buffer_[area.start.scan], first_portion_length);
				memcpy(&destination[first_portion_length], &scan_buffer_[0], new_scans_size - first_portion_length);
			}

			// Flush and unmap the buffer.
			test_gl(glFlushMappedBufferRange, GL_ARRAY_BUFFER, 0, GLsizeiptr(new_scans_size));
			test_gl(glUnmapBuffer, GL_ARRAY_BUFFER);
		}

		// Submit texture.
		if(area.start.write_area_x != area.end.write_area_x || area.start.write_area_y != area.end.write_area_y) {
			test_gl(glActiveTexture, SourceDataTextureUnit);
			test_gl(glBindTexture, GL_TEXTURE_2D, write_area_texture_name_);

			// Create storage for the texture if it doesn't yet exist; this was deferred until here
			// because the pixel format wasn't initially known.
			if(!texture_exists_) {
				test_gl(glTexParameteri, GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
				test_gl(glTexParameteri, GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
				test_gl(glTexParameteri, GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				test_gl(glTexParameteri, GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				test_gl(glTexImage2D,
					GL_TEXTURE_2D,
					0,
					internalFormatForDepth(write_area_data_size()),
					WriteAreaWidth,
					WriteAreaHeight,
					0,
					formatForDepth(write_area_data_size()),
					GL_UNSIGNED_BYTE,
					nullptr);
				texture_exists_ = true;
			}

			if(area.end.write_area_y >= area.start.write_area_y) {
				// Submit the direct region from the submit pointer to the read pointer.
				test_gl(glTexSubImage2D,
					GL_TEXTURE_2D, 0,
					0, area.start.write_area_y,
					WriteAreaWidth,
					1 + area.end.write_area_y - area.start.write_area_y,
					formatForDepth(write_area_data_size()),
					GL_UNSIGNED_BYTE,
					&write_area_texture_[size_t(area.start.write_area_y * WriteAreaWidth) * write_area_data_size()]);
			} else {
				// The circular buffer wrapped around; submit the data from the read pointer to the end of
				// the buffer and from the start of the buffer to the submit pointer.
				test_gl(glTexSubImage2D,
					GL_TEXTURE_2D, 0,
					0, area.start.write_area_y,
					WriteAreaWidth,
					WriteAreaHeight - area.start.write_area_y,
					formatForDepth(write_area_data_size()),
					GL_UNSIGNED_BYTE,
					&write_area_texture_[size_t(area.start.write_area_y * WriteAreaWidth) * write_area_data_size()]);
				test_gl(glTexSubImage2D,
					GL_TEXTURE_2D, 0,
					0, 0,
					WriteAreaWidth,
					1 + area.end.write_area_y,
					formatForDepth(write_area_data_size()),
					GL_UNSIGNED_BYTE,
					&write_area_texture_[0]);
			}
		}

		// Push new input to the unprocessed line buffer.
		if(new_scans) {
			unprocessed_line_texture_.bind_framebuffer();

			// Clear newly-touched lines; that is everything from (read+1) to submit.
			const auto first_line_to_clear = GLsizei((area.start.line+1)%line_buffer_.size());
			const auto final_line_to_clear = GLsizei(area.end.line);
			if(first_line_to_clear != final_line_to_clear) {
				test_gl(glEnable, GL_SCISSOR_TEST);

				// Determine the proper clear colour — this needs to be anything that describes black
				// in the input colour encoding at use.
				if(modals().input_data_type == InputDataType::Luminance8Phase8) {
					// Supply both a zero luminance and a colour-subcarrier-disengaging phase.
					test_gl(glClearColor, 0.0f, 1.0f, 0.0f, 0.0f);
				} else {
					test_gl(glClearColor, 0.0f, 0.0f, 0.0f, 0.0f);
				}

				if(first_line_to_clear < final_line_to_clear) {
					test_gl(glScissor, GLint(0), GLint(first_line_to_clear), unprocessed_line_texture_.get_width(), final_line_to_clear - first_line_to_clear);
					test_gl(glClear, GL_COLOR_BUFFER_BIT);
				} else {
					test_gl(glScissor, GLint(0), GLint(0), unprocessed_line_texture_.get_width(), final_line_to_clear);
					test_gl(glClear, GL_COLOR_BUFFER_BIT);
					test_gl(glScissor, GLint(0), GLint(first_line_to_clear), unprocessed_line_texture_.get_width(), unprocessed_line_texture_.get_height() - first_line_to_clear);
					test_gl(glClear, GL_COLOR_BUFFER_BIT);
				}

				test_gl(glDisable, GL_SCISSOR_TEST);
			}

			// Apply new spans. They definitely always go to the first buffer.
			test_gl(glBindVertexArray, scan_vertex_array_);
			input_shader_->bind();
			test_gl(glDrawArraysInstanced, GL_TRIANGLE_STRIP, 0, 4, GLsizei(new_scans));
		}

		// Logic for reducing resolution: start doing so if the metrics object reports that
		// it's a good idea. Go up to a quarter of the requested resolution, subject to
		// clamping at each stage. If the output resolution changes, or anything else about
		// the output pipeline, just start trying the highest size again.
		if(display_metrics_.should_lower_resolution() && is_soft_display_type()) {
			resolution_reduction_level_ = std::min(resolution_reduction_level_+1, 4);
		}
		if(output_height_ != output_height || did_setup_pipeline) {
			resolution_reduction_level_ = 1;
			output_height_ = output_height;
		}

		// Ensure the accumulation buffer is properly sized, allowing for the metrics object's
		// feelings about whether too high a resolution is being used.
		const int framebuffer_height = std::max(output_height / resolution_reduction_level_, std::min(540, output_height));
		const int proportional_width = (framebuffer_height * 4) / 3;
		const bool did_create_accumulation_texture = !accumulation_texture_ || ( (accumulation_texture_->get_width() != proportional_width || accumulation_texture_->get_height() != framebuffer_height));

		// Work with the accumulation_buffer_ potentially starts from here onwards; set its flag.
		while(is_drawing_to_accumulation_buffer_.test_and_set());
		if(did_create_accumulation_texture) {
			logger.info().append("Changed output resolution to %d by %d", proportional_width, framebuffer_height);
			display_metrics_.announce_did_resize();
			std::unique_ptr<OpenGL::TextureTarget> new_framebuffer(
				new TextureTarget(
					GLsizei(proportional_width),
					GLsizei(framebuffer_height),
					AccumulationTextureUnit,
					GL_NEAREST,
					true));
			if(accumulation_texture_) {
				new_framebuffer->bind_framebuffer();
				test_gl(glClear, GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

				test_gl(glActiveTexture, AccumulationTextureUnit);
				accumulation_texture_->bind_texture();
				accumulation_texture_->draw(4.0f / 3.0f);

				test_gl(glClear, GL_STENCIL_BUFFER_BIT);

				new_framebuffer->bind_texture();
			}
			accumulation_texture_ = std::move(new_framebuffer);

			// In the absence of a way to resize a stencil buffer, just mark
			// what's currently present as invalid to avoid an improper clear
			// for this frame.
			stencil_is_valid_ = false;
		}

		if(did_setup_pipeline || did_create_accumulation_texture) {
			set_sampling_window(proportional_width, framebuffer_height, *output_shader_);
		}

		// Figure out how many new lines are ready.
		auto new_lines = (area.end.line - area.start.line + LineBufferHeight) % LineBufferHeight;
		if(new_lines) {
			// Prepare to output lines.
			test_gl(glBindVertexArray, line_vertex_array_);

			// Bind the accumulation framebuffer, unless there's going to be QAM work first.
			if(!qam_separation_shader_ || line_metadata_buffer_[area.start.line].is_first_in_frame) {
				accumulation_texture_->bind_framebuffer();
				output_shader_->bind();

				// Enable blending and stenciling.
				test_gl(glEnable, GL_BLEND);
				test_gl(glEnable, GL_STENCIL_TEST);
			}

			// Set the proper stencil function regardless.
			test_gl(glStencilFunc, GL_EQUAL, 0, GLuint(~0));
			test_gl(glStencilOp, GL_KEEP, GL_KEEP, GL_INCR);

			// Prepare to upload data that will consitute lines.
			test_gl(glBindBuffer, GL_ARRAY_BUFFER, line_buffer_name_);

			// Divide spans by which frame they're in.
			auto start_line = area.start.line;
			while(new_lines) {
				uint16_t end_line = (start_line + 1) % LineBufferHeight;

				// Find the limit of spans to draw in this cycle.
				size_t lines = 1;
				while(end_line != area.end.line && !line_metadata_buffer_[end_line].is_first_in_frame) {
					end_line = (end_line + 1) % LineBufferHeight;
					++lines;
				}

				// If this is start-of-frame, clear any untouched pixels and flush the stencil buffer
				if(line_metadata_buffer_[start_line].is_first_in_frame) {
					if(stencil_is_valid_ && line_metadata_buffer_[start_line].previous_frame_was_complete) {
						full_display_rectangle_.draw(0.0f, 0.0f, 0.0f);
					}
					stencil_is_valid_ = true;
					test_gl(glClear, GL_STENCIL_BUFFER_BIT);

					// Rebind the program for span output.
					test_gl(glBindVertexArray, line_vertex_array_);
					if(!qam_separation_shader_) {
						output_shader_->bind();
					}
				}

				// Upload.
				const auto buffer_size = lines * sizeof(Line);
				if(!end_line || end_line > start_line) {
					test_gl(glBufferSubData, GL_ARRAY_BUFFER, 0, GLsizeiptr(buffer_size), &line_buffer_[start_line]);
				} else {
					uint8_t *destination = static_cast<uint8_t *>(
						glMapBufferRange(GL_ARRAY_BUFFER, 0, GLsizeiptr(buffer_size), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT)
					);
					assert(destination);
					test_gl_error();

					const size_t buffer_length = line_buffer_.size() * sizeof(Line);
					const size_t start_position = start_line * sizeof(Line);
					memcpy(&destination[0], &line_buffer_[start_line], buffer_length - start_position);
					memcpy(&destination[buffer_length - start_position], &line_buffer_[0], end_line * sizeof(Line));

					test_gl(glFlushMappedBufferRange, GL_ARRAY_BUFFER, 0, GLsizeiptr(buffer_size));
					test_gl(glUnmapBuffer, GL_ARRAY_BUFFER);
				}

				// Produce colour information, if required.
				if(qam_separation_shader_) {
					qam_separation_shader_->bind();
					qam_chroma_texture_->bind_framebuffer();
					test_gl(glClear, GL_COLOR_BUFFER_BIT);	// TODO: this is here as a hint that the old framebuffer doesn't need reloading;
															// test whether that's a valid optimisation on desktop OpenGL.

					test_gl(glDisable, GL_BLEND);
					test_gl(glDisable, GL_STENCIL_TEST);
					test_gl(glDrawArraysInstanced, GL_TRIANGLE_STRIP, 0, 4, GLsizei(lines));

					accumulation_texture_->bind_framebuffer();
					output_shader_->bind();
					test_gl(glEnable, GL_BLEND);
					test_gl(glEnable, GL_STENCIL_TEST);
				}

				// Render to the output.
				test_gl(glDrawArraysInstanced, GL_TRIANGLE_STRIP, 0, 4, GLsizei(lines));

				start_line = end_line;
				new_lines -= lines;
			}

			// Disable blending and the stencil test again.
			test_gl(glDisable, GL_STENCIL_TEST);
			test_gl(glDisable, GL_BLEND);
		}

		// That's it for operations affecting the accumulation buffer.
		is_drawing_to_accumulation_buffer_.clear();

		// Grab a fence sync object to avoid busy waiting upon the next extry into this
		// function, and reset the is_updating_ flag.
		fence_ = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		complete_output_area(area);
	});
}